

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlReplaceNode(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlNodePtr node;
  PyObject *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  PyObject *pyobj_cur;
  PyObject *pyobj_old;
  undefined *local_18;
  undefined *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OO:xmlReplaceNode",&local_10,&local_18);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(local_10 + 0x10);
    }
    if (local_18 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_18 + 0x10);
    }
    node = (xmlNodePtr)xmlReplaceNode(uVar4,uVar3);
    pPVar2 = libxml_xmlNodePtrWrap(node);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlReplaceNode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlNodePtr old;
    PyObject *pyobj_old;
    xmlNodePtr cur;
    PyObject *pyobj_cur;

    if (!PyArg_ParseTuple(args, (char *)"OO:xmlReplaceNode", &pyobj_old, &pyobj_cur))
        return(NULL);
    old = (xmlNodePtr) PyxmlNode_Get(pyobj_old);
    cur = (xmlNodePtr) PyxmlNode_Get(pyobj_cur);

    c_retval = xmlReplaceNode(old, cur);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}